

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O1

void __thiscall
sf::RenderTarget::setupDraw(RenderTarget *this,bool useVertexCache,RenderStates *states)

{
  bool bVar1;
  int iVar2;
  PFNGLENABLEPROC *pp_Var3;
  Uint64 UVar4;
  socklen_t extraout_EDX;
  socklen_t extraout_EDX_00;
  socklen_t extraout_EDX_01;
  socklen_t __len;
  RenderStates *right;
  RenderTarget *this_00;
  Texture *pTVar5;
  
  this_00 = this;
  if ((this->m_cache).enable == false) {
    iVar2 = (*this->_vptr_RenderTarget[3])(this);
    if ((char)iVar2 == '\0') {
      pp_Var3 = &sf_glad_glDisable;
    }
    else {
      pp_Var3 = &sf_glad_glEnable;
    }
    this_00 = (RenderTarget *)0x8db9;
    (**pp_Var3)(0x8db9);
  }
  if ((this->m_cache).glStatesSet == false) {
    this_00 = this;
    resetGLStates(this);
  }
  if (useVertexCache) {
    if (((this->m_cache).enable != true) || ((this->m_cache).useVertexCache == false)) {
      (*sf_glad_glLoadIdentity)();
    }
  }
  else {
    applyTransform(this_00,&states->transform);
  }
  if (((this->m_cache).enable != true) || ((this->m_cache).viewChanged == true)) {
    applyCurrentView(this);
  }
  if ((this->m_cache).enable == true) {
    right = (RenderStates *)&(this->m_cache).lastBlendMode;
    bVar1 = operator!=(&states->blendMode,(BlendMode *)right);
    __len = extraout_EDX;
    if (bVar1) goto LAB_001c13aa;
  }
  else {
LAB_001c13aa:
    right = states;
    applyBlendMode(this,&states->blendMode);
    __len = extraout_EDX_00;
  }
  if ((this->m_cache).enable == true) {
    pTVar5 = states->texture;
    if (pTVar5 == (Texture *)0x0) {
LAB_001c13e0:
      UVar4 = 0;
    }
    else {
      if (pTVar5->m_fboAttachment == true) goto LAB_001c13cf;
      if (pTVar5 == (Texture *)0x0) goto LAB_001c13e0;
      UVar4 = pTVar5->m_cacheId;
    }
    if (UVar4 == (this->m_cache).lastTextureId) goto LAB_001c140c;
  }
  else {
LAB_001c13cf:
    pTVar5 = states->texture;
  }
  right = (RenderStates *)0x1;
  Texture::bind((int)pTVar5,(sockaddr *)0x1,__len);
  if (pTVar5 == (Texture *)0x0) {
    UVar4 = 0;
  }
  else {
    UVar4 = pTVar5->m_cacheId;
  }
  (this->m_cache).lastTextureId = UVar4;
  __len = extraout_EDX_01;
LAB_001c140c:
  if (states->shader != (Shader *)0x0) {
    Shader::bind((int)states->shader,(sockaddr *)right,__len);
    return;
  }
  return;
}

Assistant:

void RenderTarget::setupDraw(bool useVertexCache, const RenderStates& states)
{
    // Enable or disable sRGB encoding
    // This is needed for drivers that do not check the format of the surface drawn to before applying sRGB conversion
    if (!m_cache.enable)
    {
        if (isSrgb())
            glCheck(glEnable(GL_FRAMEBUFFER_SRGB));
        else
            glCheck(glDisable(GL_FRAMEBUFFER_SRGB));
    }

    // First set the persistent OpenGL states if it's the very first call
    if (!m_cache.glStatesSet)
        resetGLStates();

    if (useVertexCache)
    {
        // Since vertices are transformed, we must use an identity transform to render them
        if (!m_cache.enable || !m_cache.useVertexCache)
            glCheck(glLoadIdentity());
    }
    else
    {
        applyTransform(states.transform);
    }

    // Apply the view
    if (!m_cache.enable || m_cache.viewChanged)
        applyCurrentView();

    // Apply the blend mode
    if (!m_cache.enable || (states.blendMode != m_cache.lastBlendMode))
        applyBlendMode(states.blendMode);

    // Apply the texture
    if (!m_cache.enable || (states.texture && states.texture->m_fboAttachment))
    {
        // If the texture is an FBO attachment, always rebind it
        // in order to inform the OpenGL driver that we want changes
        // made to it in other contexts to be visible here as well
        // This saves us from having to call glFlush() in
        // RenderTextureImplFBO which can be quite costly
        // See: https://www.khronos.org/opengl/wiki/Memory_Model
        applyTexture(states.texture);
    }
    else
    {
        Uint64 textureId = states.texture ? states.texture->m_cacheId : 0;
        if (textureId != m_cache.lastTextureId)
            applyTexture(states.texture);
    }

    // Apply the shader
    if (states.shader)
        applyShader(states.shader);
}